

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# exrmetrics.cpp
# Opt level: O2

void rereadFile(MultiPartInputFile *in,vector<partData,_std::allocator<partData>_> *parts,
               fileMetrics *metrics)

{
  pointer ppVar1;
  __type _Var2;
  string *psVar3;
  long lVar4;
  int iVar5;
  ulong uVar6;
  long local_70;
  InputPart inpart;
  string type;
  
  lVar4 = 0x60;
  local_70 = 0x1e8;
  for (uVar6 = 0;
      uVar6 < (ulong)(((long)(parts->super__Vector_base<partData,_std::allocator<partData>_>).
                             _M_impl.super__Vector_impl_data._M_finish -
                      (long)(parts->super__Vector_base<partData,_std::allocator<partData>_>)._M_impl
                            .super__Vector_impl_data._M_start) / 0x250); uVar6 = uVar6 + 1) {
    Imf_3_4::MultiPartInputFile::header((int)in);
    psVar3 = (string *)Imf_3_4::Header::type_abi_cxx11_();
    std::__cxx11::string::string((string *)&type,psVar3);
    _Var2 = std::operator==(&type,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                   *)Imf_3_4::SCANLINEIMAGE_abi_cxx11_);
    iVar5 = (int)uVar6;
    if (_Var2) {
      Imf_3_4::InputPart::InputPart(&inpart,in,iVar5);
      readScanLine(&inpart,(FrameBuffer *)
                           ((long)(parts->super__Vector_base<partData,_std::allocator<partData>_>).
                                  _M_impl.super__Vector_impl_data._M_start + local_70 + -0x48),
                   (vector<double,_std::allocator<double>_> *)
                   ((long)&(((metrics->stats).
                             super__Vector_base<partStats,_std::allocator<partStats>_>._M_impl.
                             super__Vector_impl_data._M_start)->countReadPerf).
                           super__Vector_base<double,_std::allocator<double>_> + lVar4));
    }
    else {
      _Var2 = std::operator==(&type,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                     *)Imf_3_4::TILEDIMAGE_abi_cxx11_);
      if (_Var2) {
        Imf_3_4::TiledInputPart::TiledInputPart((TiledInputPart *)&inpart,in,iVar5);
        readTiled((TiledInputPart *)&inpart,
                  (vector<Imf_3_4::FrameBuffer,_std::allocator<Imf_3_4::FrameBuffer>_> *)
                  ((long)(parts->super__Vector_base<partData,_std::allocator<partData>_>)._M_impl.
                         super__Vector_impl_data._M_start + local_70 + -0x18),
                  (vector<double,_std::allocator<double>_> *)
                  ((long)&(((metrics->stats).
                            super__Vector_base<partStats,_std::allocator<partStats>_>._M_impl.
                            super__Vector_impl_data._M_start)->countReadPerf).
                          super__Vector_base<double,_std::allocator<double>_> + lVar4));
      }
      else {
        _Var2 = std::operator==(&type,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                       *)Imf_3_4::DEEPSCANLINE_abi_cxx11_);
        if (_Var2) {
          Imf_3_4::DeepScanLineInputPart::DeepScanLineInputPart
                    ((DeepScanLineInputPart *)&inpart,in,iVar5);
          ppVar1 = (metrics->stats).super__Vector_base<partStats,_std::allocator<partStats>_>.
                   _M_impl.super__Vector_impl_data._M_start;
          readDeepScanLine((DeepScanLineInputPart *)&inpart,
                           (DeepFrameBuffer *)
                           ((long)&(((parts->super__Vector_base<partData,_std::allocator<partData>_>
                                     )._M_impl.super__Vector_impl_data._M_start)->readBuf).
                                   scanlinePixelData.
                                   super__Vector_base<std::vector<char,_std::allocator<char>_>,_std::allocator<std::vector<char,_std::allocator<char>_>_>_>
                           + local_70),
                           (vector<double,_std::allocator<double>_> *)
                           ((long)&(ppVar1->countReadPerf).
                                   super__Vector_base<double,_std::allocator<double>_> + lVar4),
                           (vector<double,_std::allocator<double>_> *)((long)ppVar1 + lVar4 + -0x18)
                          );
        }
        else {
          _Var2 = std::operator==(&type,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                         *)Imf_3_4::DEEPTILE_abi_cxx11_);
          if (_Var2) {
            Imf_3_4::DeepTiledInputPart::DeepTiledInputPart((DeepTiledInputPart *)&inpart,in,iVar5);
            ppVar1 = (metrics->stats).super__Vector_base<partStats,_std::allocator<partStats>_>.
                     _M_impl.super__Vector_impl_data._M_start;
            readDeepTiled((DeepTiledInputPart *)&inpart,
                          (DeepFrameBuffer *)
                          ((long)&(((parts->super__Vector_base<partData,_std::allocator<partData>_>)
                                    ._M_impl.super__Vector_impl_data._M_start)->readBuf).
                                  scanlinePixelData.
                                  super__Vector_base<std::vector<char,_std::allocator<char>_>,_std::allocator<std::vector<char,_std::allocator<char>_>_>_>
                          + local_70),
                          (vector<double,_std::allocator<double>_> *)
                          ((long)&(ppVar1->countReadPerf).
                                  super__Vector_base<double,_std::allocator<double>_> + lVar4),
                          (vector<double,_std::allocator<double>_> *)((long)ppVar1 + lVar4 + -0x18))
            ;
          }
        }
      }
    }
    std::__cxx11::string::~string((string *)&type);
    lVar4 = lVar4 + 0xc0;
    local_70 = local_70 + 0x250;
  }
  return;
}

Assistant:

void
rereadFile (
    MultiPartInputFile& in, vector<partData>& parts, fileMetrics& metrics)
{
    //
    // Call initialization functions, Read image from source.
    //
    for (size_t p = 0; p < parts.size (); ++p)
    {
        string type = in.header (p).type ();

        if (type == SCANLINEIMAGE)
        {
            InputPart inpart (in, p);
            readScanLine (
                inpart,
                parts[p].rereadBuf.scanlineBuf,
                metrics.stats[p].rereadPerf);
        }
        else if (type == TILEDIMAGE)
        {
            TiledInputPart inpart (in, p);
            readTiled (
                inpart,
                parts[p].rereadBuf.tiledBuf,
                metrics.stats[p].rereadPerf);
        }
        else if (type == DEEPSCANLINE)
        {
            DeepScanLineInputPart inpart (in, p);
            readDeepScanLine (
                inpart,
                parts[p].rereadBuf.deepbuf,
                metrics.stats[p].rereadPerf,
                metrics.stats[p].countRereadPerf);
        }
        else if (type == DEEPTILE)
        {
            DeepTiledInputPart inpart (in, p);
            readDeepTiled (
                inpart,
                parts[p].rereadBuf.deepbuf,
                metrics.stats[p].rereadPerf,
                metrics.stats[p].countRereadPerf);
        }
    }
}